

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recommend.cc
# Opt level: O2

int bf_hit(char *bf,char *line)

{
  uint *puVar1;
  size_t len;
  long lVar2;
  uint hashv [2];
  
  len = strlen(line);
  get_hashv(line,len,hashv);
  lVar2 = 0;
  do {
    if (lVar2 == 2) {
      return 1;
    }
    puVar1 = hashv + lVar2;
    lVar2 = lVar2 + 1;
  } while (((byte)bf[*puVar1 >> 3] >> (*puVar1 & 7) & 1) != 0);
  return 0;
}

Assistant:

int bf_hit(char *bf, char *line)
{ unsigned i, hashv[NUM_HASHES];
  get_hashv(line,strlen(line),hashv);
  for(i=0; i<NUM_HASHES; i++)
  { if (BIT_TEST(bf,hashv[i])==0) return 0;
  }
  return 1;
}